

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_ref_t * wasm_table_get(wasm_table_t *table,wasm_table_size_t index)

{
  bool bVar1;
  Table *this;
  Store *this_00;
  RefPtr<wabt::interp::Object> local_58;
  size_t local_40;
  size_t local_38;
  Enum local_2c;
  Ref local_28;
  Ref ref;
  wasm_table_size_t index_local;
  wasm_table_t *table_local;
  
  ref.index._4_4_ = index;
  this = wasm_ref_t::As<wabt::interp::Table>((wasm_ref_t *)table);
  local_2c = (Enum)wabt::interp::Table::Get(this,ref.index._4_4_,&local_28);
  bVar1 = wabt::Failed((Result)local_2c);
  if (bVar1) {
    table_local = (wasm_table_t *)0x0;
  }
  else {
    local_38 = local_28.index;
    local_40 = wabt::interp::Ref::Null.index;
    bVar1 = wabt::interp::operator==(local_28,wabt::interp::Ref::Null);
    if (bVar1) {
      table_local = (wasm_table_t *)0x0;
    }
    else {
      table_local = (wasm_table_t *)operator_new(0x18);
      this_00 = wabt::interp::RefPtr<wabt::interp::Object>::store
                          ((RefPtr<wabt::interp::Object> *)table);
      wabt::interp::Store::UnsafeGet<wabt::interp::Object>(&local_58,this_00,local_28);
      wasm_ref_t::wasm_ref_t((wasm_ref_t *)table_local,&local_58);
      wabt::interp::RefPtr<wabt::interp::Object>::~RefPtr(&local_58);
    }
  }
  return (wasm_ref_t *)table_local;
}

Assistant:

own wasm_ref_t* wasm_table_get(const wasm_table_t* table,
                               wasm_table_size_t index) {
  Ref ref;
  if (Failed(table->As<Table>()->Get(index, &ref))) {
    return nullptr;
  }
  if (ref == Ref::Null) {
    return nullptr;
  }
  return new wasm_ref_t{table->I.store()->UnsafeGet<Object>(ref)};
}